

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O0

void Lsp_Az(tetra_codec *st,Word16 *lsp,Word16 *a)

{
  Word16 WVar1;
  Word32 WVar2;
  undefined2 *in_RDX;
  tetra_codec *in_RDI;
  Word32 t0;
  Word32 f2 [6];
  Word32 f1 [6];
  Word16 j;
  Word16 i;
  Word32 aWStackY_20058 [32764];
  Word16 in_stack_ffffffffffffff9a;
  Word32 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Word16 *in_stack_ffffffffffffffa8;
  tetra_codec *in_stack_ffffffffffffffb0;
  short local_1c;
  short local_1a;
  undefined2 *local_18;
  tetra_codec *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  Get_Lsp_Pol(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
              (Word32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  Get_Lsp_Pol(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
              (Word32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  for (local_1a = 5; 0 < local_1a; local_1a = local_1a + -1) {
    WVar2 = L_add(local_8,*(Word32 *)(&stack0xffffffffffffffc8 + (long)local_1a * 4),
                  *(Word32 *)(&stack0xffffffffffffffc8 + (long)(local_1a + -1) * 4));
    *(Word32 *)(&stack0xffffffffffffffc8 + (long)local_1a * 4) = WVar2;
    WVar2 = L_sub(local_8,*(Word32 *)(&stack0xffffffffffffffa8 + (long)local_1a * 4),
                  *(Word32 *)(&stack0xffffffffffffffa8 + (long)(local_1a + -1) * 4));
    *(Word32 *)(&stack0xffffffffffffffa8 + (long)local_1a * 4) = WVar2;
  }
  *local_18 = 0x1000;
  local_1c = 10;
  for (local_1a = 1; local_1a < 6; local_1a = local_1a + 1) {
    WVar2 = L_add(local_8,*(Word32 *)(&stack0xffffffffffffffc8 + (long)local_1a * 4),
                  *(Word32 *)(&stack0xffffffffffffffa8 + (long)local_1a * 4));
    WVar2 = L_shr_r((tetra_codec *)CONCAT44(WVar2,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c,in_stack_ffffffffffffff9a);
    WVar1 = extract_l(WVar2);
    local_18[local_1a] = WVar1;
    WVar2 = L_sub(local_8,*(Word32 *)(&stack0xffffffffffffffc8 + (long)local_1a * 4),
                  *(Word32 *)(&stack0xffffffffffffffa8 + (long)local_1a * 4));
    WVar2 = L_shr_r((tetra_codec *)CONCAT44(WVar2,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c,in_stack_ffffffffffffff9a);
    WVar1 = extract_l(WVar2);
    local_18[local_1c] = WVar1;
    local_1c = local_1c + -1;
  }
  return;
}

Assistant:

void Lsp_Az(tetra_codec* st, Word16 lsp[], Word16 a[])
{
  Word16 i, j;
  Word32 f1[6], f2[6];
  Word32 t0;

  Get_Lsp_Pol(st, &lsp[0],f1);
  Get_Lsp_Pol(st, &lsp[1],f2);

  for (i = 5; i > 0; i--)
  {
    f1[i] = L_add(st, f1[i], f1[i-1]);			/* f1[i] += f1[i-1]; */
    f2[i] = L_sub(st, f2[i], f2[i-1]);			/* f2[i] -= f2[i-1]; */
  }

  a[0] = 4096;
  for (i = 1, j = 10; i <= 5; i++, j--)
  {
    t0   = L_add(st, f1[i], f2[i]);			/* f1[i] + f2[i] */
    a[i] = extract_l( L_shr_r(st, t0,(Word16)13) );	/*from Q24 to Q12 and * 0.5*/
    t0   = L_sub(st, f1[i], f2[i]);			/* f1[i] - f2[i] */
    a[j] = extract_l( L_shr_r(st, t0,(Word16)13) );	/*from Q24 to Q12 and * 0.5*/
  }

  return;
}